

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O2

void __thiscall mp::SafeInt<int>::SafeInt<unsigned_long>(SafeInt<int> *this,unsigned_long value)

{
  undefined8 *puVar1;
  
  this->value_ = (int)value;
  if ((value & 0xffffffff80000000) == 0) {
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_004c4668;
  __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

explicit SafeInt(U value) : value_(static_cast<T>(value)) {
    if (fmt::internal::is_negative(value)) {
      fmt::LongLong signed_value = value, min = std::numeric_limits<T>::min();
      if (signed_value < min)
        throw OverflowError();
    } else {
      typename MakeUnsigned<U>::Type unsigned_value = value;
      typename MakeUnsigned<T>::Type max = std::numeric_limits<T>::max();
      if (unsigned_value > max)
        throw OverflowError();
    }
  }